

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_scene.cpp
# Opt level: O3

void __thiscall FGLRenderer::DrawBlend(FGLRenderer *this,sector_t *viewsector)

{
  extsector_t *peVar1;
  lightlist_t *plVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  undefined8 *puVar6;
  player_t *CPlayer;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  long lVar10;
  ulong uVar11;
  double *pdVar12;
  float fVar13;
  float fVar14;
  double dVar15;
  float fVar16;
  float blend [4];
  float local_38 [6];
  
  local_38[0] = 0.0;
  local_38[1] = 0.0;
  local_38[2] = 0.0;
  local_38[3] = 0.0;
  lVar10 = (&DAT_00a60408)[(long)consoleplayer * 0x54];
  if (lVar10 == 0) {
LAB_004752eb:
    CPlayer = (player_t *)0x0;
  }
  else {
    if ((*(byte *)(lVar10 + 0x20) & 0x20) != 0) {
      (&DAT_00a60408)[(long)consoleplayer * 0x54] = 0;
      goto LAB_004752eb;
    }
    CPlayer = *(player_t **)(lVar10 + 0x200);
  }
  if (gl_fixedcolormap != 0) goto LAB_004752fa;
  peVar1 = viewsector->e;
  if ((peVar1->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count == 0) {
    if ((viewsector->heightsec == (sector_t *)0x0) || ((viewsector->MoreFlags & 0x10) != 0))
    goto LAB_0047557a;
    lVar10 = 0x1a8;
    if (in_area != area_below) {
      lVar10 = (ulong)(in_area == area_above) * 4 + 0x1ac;
    }
    uVar3 = *(uint *)((long)&viewsector->heightsec->planes[0].xform.xOffs + lVar10);
    uVar11 = (ulong)uVar3;
    uVar7 = uVar3 >> 0x10;
    uVar8 = uVar3 >> 8;
    if (uVar3 < 0x1000000) goto LAB_00475580;
LAB_0047565c:
    uVar3 = (uint)uVar11;
    uVar4 = (uint)(uVar11 >> 0x18);
LAB_00475661:
    if (uVar4 == 0) goto LAB_004752fa;
    if (uVar4 != 0xff) {
LAB_00475705:
      V_AddBlend((float)(uVar7 & 0xff) * 0.003921569,(float)(uVar8 & 0xff) * 0.003921569,
                 (float)(uVar3 & 0xff) * 0.003921569,(float)uVar4 * 0.003921569,local_38);
      goto LAB_004752fa;
    }
  }
  else {
    uVar3 = (peVar1->XFloor).lightlist.Count;
    if ((ulong)uVar3 != 0) {
      lVar10 = 0x70;
      uVar11 = 0;
      do {
        if (uVar11 < uVar3 - 1) {
          plVar2 = (peVar1->XFloor).lightlist.Array;
          pdVar12 = (double *)((long)plVar2 + lVar10 + -0x20);
          dVar15 = pdVar12[1] * ViewPos.Y +
                   *(double *)((long)plVar2 + lVar10 + -8) + *pdVar12 * ViewPos.X;
          pdVar12 = (double *)((long)&(plVar2->plane).normal.X + lVar10);
        }
        else {
          dVar15 = (viewsector->floorplane).normal.Y * ViewPos.Y +
                   (viewsector->floorplane).D + (viewsector->floorplane).normal.X * ViewPos.X;
          pdVar12 = &(viewsector->floorplane).negiC;
        }
        if (dVar15 * *pdVar12 < ViewPos.Z) {
          plVar2 = (peVar1->XFloor).lightlist.Array;
          lVar5 = *(long *)((long)plVar2 + lVar10 + -0x28);
          if ((lVar5 == 0) || ((*(byte *)(lVar5 + 0x5b) & 8) == 0)) {
            uVar3 = *(uint *)((long)plVar2 + lVar10 + -0x38);
            uVar11 = (ulong)uVar3;
            if (uVar3 == (viewsector->ColorMap->Fade).field_0.d) {
              uVar7 = 0;
              uVar8 = 0;
              uVar11 = 0;
            }
            else {
              uVar8 = uVar3 >> 8;
              uVar7 = uVar3 >> 0x10;
              if (0xffffff < uVar3) goto LAB_0047565c;
            }
            uVar3 = (uint)uVar11;
            uVar4 = 0x80;
            if ((uVar11 & 0xff) == 0 && ((uVar8 & 0xff) == 0 && (uVar7 & 0xff) == 0))
            goto LAB_00475580;
            goto LAB_00475705;
          }
        }
        uVar11 = uVar11 + 1;
        lVar10 = lVar10 + 0x50;
      } while (uVar3 != uVar11);
    }
LAB_0047557a:
    uVar7 = 0;
    uVar8 = 0;
    uVar3 = 0;
LAB_00475580:
    uVar3 = R_BlendForColormap(uVar3 & 0xff | (uVar8 & 0xff) << 8 | (uVar7 & 0xff) << 0x10);
    uVar8 = uVar3 >> 8;
    uVar7 = uVar3 >> 0x10;
    uVar4 = uVar3 >> 0x18;
    if (uVar4 != 0xff) goto LAB_00475661;
    uVar4 = this->framebuffer->palette_brightness;
    uVar7 = uVar7 & 0xff;
    if ((int)uVar4 <= (int)uVar7) {
      uVar4 = uVar7;
    }
    uVar8 = uVar8 & 0xff;
    uVar3 = uVar3 & 0xff;
    uVar9 = uVar3;
    if (uVar3 < uVar8) {
      uVar9 = uVar8;
    }
    if (uVar9 < uVar4) {
      uVar9 = uVar4;
    }
    uVar7 = (uVar7 * 0xff) / uVar9;
    uVar8 = (uVar8 * 0xff) / uVar9;
    uVar3 = (uVar3 * 0xff) / uVar9;
  }
  fVar13 = (float)(uVar7 & 0xff) * 0.003921569;
  fVar14 = (float)(uVar8 & 0xff) * 0.003921569;
  fVar16 = (float)(uVar3 & 0xff) * 0.003921569;
  if (((fVar13 != 0.0) || (fVar14 != 0.0)) || (fVar16 != 0.0)) {
    if (gl_direct_state_change.Value == false) {
      gl_RenderState.mSrcBlend = 0x306;
      gl_RenderState.mDstBlend = 0;
    }
    else {
      (*_ptrc_glBlendFunc)(0x306,0);
    }
    gl_RenderState.mColor.vec[1] = fVar14;
    gl_RenderState.mColor.vec[0] = fVar13;
    gl_RenderState.mColor.vec[3] = 1.0;
    gl_RenderState.mColor.vec[2] = fVar16;
    gl_RenderState.mDesaturation = 0;
    gl_RenderState.mAlphaThreshold = -0.001;
    gl_RenderState.mTextureEnabled = false;
    FRenderState::Apply(&gl_RenderState);
    (*_ptrc_glDrawArrays)(5,4,4);
  }
LAB_004752fa:
  if (CPlayer != (player_t *)0x0) {
    V_AddPlayerBlend(CPlayer,local_38,0.5,0xaf);
  }
  lVar5 = (long)consoleplayer;
  lVar10 = (&DAT_00a60408)[lVar5 * 0x54];
  if (lVar10 != 0) {
    if ((*(byte *)(lVar10 + 0x20) & 0x20) == 0) {
      puVar6 = &players + lVar5 * 0x54;
      if (*(undefined8 **)(lVar10 + 0x200) != (undefined8 *)0x0) {
        puVar6 = *(undefined8 **)(lVar10 + 0x200);
      }
      V_AddBlend(*(float *)(puVar6 + 0x34),*(float *)((long)puVar6 + 0x1a4),
                 *(float *)(puVar6 + 0x35),*(float *)((long)puVar6 + 0x1ac),local_38);
    }
    else {
      (&DAT_00a60408)[lVar5 * 0x54] = 0;
    }
  }
  if (gl_direct_state_change.Value == false) {
    gl_RenderState.mSrcBlend = 0x302;
    gl_RenderState.mDstBlend = 0x303;
  }
  else {
    (*_ptrc_glBlendFunc)(0x302,0x303);
  }
  if (0.0 < local_38[3]) {
    gl_RenderState.mColor.vec[0] = local_38[0];
    gl_RenderState.mColor.vec[1] = local_38[1];
    gl_RenderState.mColor.vec[2] = local_38[2];
    gl_RenderState.mColor.vec[3] = local_38[3];
    gl_RenderState.mDesaturation = 0;
    gl_RenderState.mAlphaThreshold = -0.001;
    gl_RenderState.mTextureEnabled = false;
    FRenderState::Apply(&gl_RenderState);
    (*_ptrc_glDrawArrays)(5,4,4);
  }
  gl_RenderState.mColor.vec[0] = 1.0;
  gl_RenderState.mColor.vec[1] = 1.0;
  gl_RenderState.mColor.vec[2] = 1.0;
  gl_RenderState.mColor.vec[3] = 1.0;
  gl_RenderState.mDesaturation = 0;
  gl_RenderState.mTextureEnabled = true;
  return;
}

Assistant:

void FGLRenderer::DrawBlend(sector_t * viewsector)
{
	float blend[4]={0,0,0,0};
	PalEntry blendv=0;
	float extra_red;
	float extra_green;
	float extra_blue;
	player_t *player = NULL;

	if (players[consoleplayer].camera != NULL)
	{
		player=players[consoleplayer].camera->player;
	}

	// don't draw sector based blends when an invulnerability colormap is active
	if (!gl_fixedcolormap)
	{
		if (!viewsector->e->XFloor.ffloors.Size())
		{
			if (viewsector->heightsec && !(viewsector->MoreFlags&SECF_IGNOREHEIGHTSEC))
			{
				switch (in_area)
				{
				default:
				case area_normal: blendv = viewsector->heightsec->midmap; break;
				case area_above: blendv = viewsector->heightsec->topmap; break;
				case area_below: blendv = viewsector->heightsec->bottommap; break;
				}
			}
		}
		else
		{
			TArray<lightlist_t> & lightlist = viewsector->e->XFloor.lightlist;

			for (unsigned int i = 0; i < lightlist.Size(); i++)
			{
				double lightbottom;
				if (i < lightlist.Size() - 1)
					lightbottom = lightlist[i + 1].plane.ZatPoint(ViewPos);
				else
					lightbottom = viewsector->floorplane.ZatPoint(ViewPos);

				if (lightbottom < ViewPos.Z && (!lightlist[i].caster || !(lightlist[i].caster->flags&FF_FADEWALLS)))
				{
					// 3d floor 'fog' is rendered as a blending value
					blendv = lightlist[i].blend;
					// If this is the same as the sector's it doesn't apply!
					if (blendv == viewsector->ColorMap->Fade) blendv = 0;
					// a little hack to make this work for Legacy maps.
					if (blendv.a == 0 && blendv != 0) blendv.a = 128;
					break;
				}
			}
		}

		if (blendv.a == 0)
		{
			blendv = R_BlendForColormap(blendv);
			if (blendv.a == 255)
			{
				// The calculated average is too dark so brighten it according to the palettes's overall brightness
				int maxcol = MAX<int>(MAX<int>(framebuffer->palette_brightness, blendv.r), MAX<int>(blendv.g, blendv.b));
				blendv.r = blendv.r * 255 / maxcol;
				blendv.g = blendv.g * 255 / maxcol;
				blendv.b = blendv.b * 255 / maxcol;
			}
		}

		if (blendv.a == 255)
		{

			extra_red = blendv.r / 255.0f;
			extra_green = blendv.g / 255.0f;
			extra_blue = blendv.b / 255.0f;

			// If this is a multiplicative blend do it separately and add the additive ones on top of it.
			blendv = 0;

			// black multiplicative blends are ignored
			if (extra_red || extra_green || extra_blue)
			{
				gl_RenderState.BlendFunc(GL_DST_COLOR, GL_ZERO);
				gl_RenderState.SetColor(extra_red, extra_green, extra_blue, 1.0f);
				gl_FillScreen();
			}
		}
		else if (blendv.a)
		{
			V_AddBlend(blendv.r / 255.f, blendv.g / 255.f, blendv.b / 255.f, blendv.a / 255.0f, blend);
		}
	}

	// This mostly duplicates the code in shared_sbar.cpp
	// When I was writing this the original was called too late so that I
	// couldn't get the blend in time. However, since then I made some changes
	// here that would get lost if I switched back so I won't do it.

	if (player)
	{
		V_AddPlayerBlend(player, blend, 0.5, 175);
	}
	
	if (players[consoleplayer].camera != NULL)
	{
		// except for fadeto effects
		player_t *player = (players[consoleplayer].camera->player != NULL) ? players[consoleplayer].camera->player : &players[consoleplayer];
		V_AddBlend (player->BlendR, player->BlendG, player->BlendB, player->BlendA, blend);
	}

	gl_RenderState.BlendFunc(GL_SRC_ALPHA, GL_ONE_MINUS_SRC_ALPHA);
	if (blend[3]>0.0f)
	{
		gl_RenderState.SetColor(blend[0], blend[1], blend[2], blend[3]);
		gl_FillScreen();
	}
	gl_RenderState.ResetColor();
	gl_RenderState.EnableTexture(true);
}